

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-ggml.cpp
# Opt level: O0

bool ggml_common_quantize_0
               (ifstream *finp,ofstream *fout,ggml_ftype ftype,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *to_quant,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *to_skip)

{
  FILE *pFVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  char *pcVar6;
  byte bVar7;
  bool bVar8;
  ulong uVar9;
  undefined8 uVar10;
  long lVar11;
  undefined8 uVar12;
  unsigned_short *puVar13;
  reference pvVar14;
  reference pvVar15;
  uchar *puVar16;
  float *pfVar17;
  float *pfVar18;
  size_type sVar19;
  undefined8 in_RCX;
  uint in_EDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  char *in_RDI;
  undefined8 in_R8;
  value_type vVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  size_t cur_size;
  int i_2;
  int bpe;
  int i_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  bool quantize;
  string name;
  int i;
  int32_t ne [4];
  int32_t nelements;
  int32_t ttype;
  int32_t length;
  int32_t n_dims;
  vector<float,_std::allocator<float>_> data_f32;
  vector<unsigned_short,_std::allocator<unsigned_short>_> data_f16;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data_u8;
  vector<float,_std::allocator<float>_> work;
  size_t total_size_new;
  size_t total_size_org;
  ggml_type qtype;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd30;
  match_flag_type in_stack_fffffffffffffd34;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd40;
  uint in_stack_fffffffffffffd44;
  size_type in_stack_fffffffffffffd48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  uchar *in_stack_fffffffffffffd60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd68;
  FILE *in_stack_fffffffffffffd70;
  long local_1a0;
  int local_198;
  int local_190;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_158;
  undefined8 local_150;
  reference local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_120;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_118;
  undefined8 local_110;
  byte local_102;
  allocator<char> local_101;
  string local_100 [36];
  int local_dc;
  ulong local_d8;
  ulong local_d0;
  int local_c8;
  uint local_b4;
  undefined1 local_b0 [4];
  int local_ac;
  vector<float,_std::allocator<float>_> local_a8;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  long local_48;
  long local_40;
  uint local_34;
  undefined8 local_30;
  undefined8 local_28;
  uint local_1c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  char *local_10;
  byte local_1;
  
  local_34 = 0;
  switch(in_EDX) {
  case 2:
    local_34 = 2;
    break;
  case 3:
    local_34 = 3;
    break;
  case 7:
    local_34 = 8;
    break;
  case 8:
    local_34 = 6;
    break;
  case 9:
    local_34 = 7;
    break;
  case 10:
    local_34 = 10;
    break;
  case 0xb:
    local_34 = 0xb;
    break;
  case 0xc:
    local_34 = 0xc;
    break;
  case 0xd:
    local_34 = 0xd;
    break;
  case 0xe:
    local_34 = 0xe;
    break;
  case 0xffffffff:
  case 0:
  case 1:
  case 4:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
    fprintf(_stderr,"%s: invalid model type %d\n","ggml_common_quantize_0",(ulong)in_EDX);
    local_1 = 0;
    goto LAB_0011283a;
  }
  local_30 = in_R8;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  uVar9 = ggml_is_quantized(local_34);
  uVar4 = local_34;
  pFVar1 = _stderr;
  if ((uVar9 & 1) == 0) {
    uVar10 = ggml_type_name(local_34);
    fprintf(pFVar1,"%s: invalid quantization type %d (%s)\n","ggml_common_quantize_0",(ulong)uVar4,
            uVar10);
    local_1 = 0;
  }
  else {
    local_40 = 0;
    local_48 = 0;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)0x111af3);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x111b00);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x111b0d);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)0x111b1a);
    do {
      std::istream::read(local_10,(long)&local_ac);
      std::istream::read(local_10,(long)local_b0);
      std::istream::read(local_10,(long)&local_b4);
      bVar7 = std::ios::eof();
      if ((bVar7 & 1) != 0) {
        auVar24._8_4_ = (int)((ulong)local_40 >> 0x20);
        auVar24._0_8_ = local_40;
        auVar24._12_4_ = 0x45300000;
        printf("%s: model size  = %8.2f MB\n",
               ((auVar24._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)local_40) - 4503599627370496.0)) * 0.0009765625 *
               0.0009765625,"ggml_common_quantize_0");
        auVar25._8_4_ = (int)((ulong)local_48 >> 0x20);
        auVar25._0_8_ = local_48;
        auVar25._12_4_ = 0x45300000;
        dVar21 = ((auVar25._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)local_48) - 4503599627370496.0)) * 0.0009765625 *
                 0.0009765625;
        uVar10 = ggml_type_name(local_34);
        printf("%s: quant size  = %8.2f MB | ftype = %d (%s)\n",dVar21,"ggml_common_quantize_0",
               (ulong)local_1c,uVar10);
        local_1 = 1;
        in_stack_fffffffffffffd44 = local_1c;
        break;
      }
      local_c8 = 1;
      local_d8 = 0x100000001;
      local_d0 = 0x100000001;
      for (local_dc = 0; local_dc < local_ac; local_dc = local_dc + 1) {
        std::istream::read(local_10,(long)&local_d8 + (long)local_dc * 4);
        local_c8 = *(int *)((long)&local_d8 + (long)local_dc * 4) * local_c8;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                 (char)(in_stack_fffffffffffffd44 >> 0x18),
                 (allocator<char> *)in_stack_fffffffffffffd38);
      std::allocator<char>::~allocator(&local_101);
      pcVar6 = local_10;
      lVar11 = std::__cxx11::string::operator[]((ulong)local_100);
      std::istream::read(pcVar6,lVar11);
      uVar10 = std::__cxx11::string::data();
      uVar3 = local_d0;
      uVar2 = local_d8;
      uVar9 = local_d8 >> 0x20;
      uVar12 = ggml_type_name(local_b4);
      printf("%64s - [%5d, %5d, %5d], type = %6s ",uVar10,uVar2 & 0xffffffff,uVar9,
             uVar3 & 0xffffffff,uVar12);
      local_102 = 0;
      local_110 = local_28;
      local_118._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(in_stack_fffffffffffffd28);
      local_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end(in_stack_fffffffffffffd28);
      while (bVar8 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                                (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffffd28), bVar8) {
        local_128 = __gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&local_118);
        std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
        basic_regex<std::char_traits<char>,std::allocator<char>>
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_fffffffffffffd70
                   ,in_stack_fffffffffffffd68,(flag_type)((ulong)in_stack_fffffffffffffd60 >> 0x20))
        ;
        bVar8 = std::
                regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                           in_stack_fffffffffffffd38,in_stack_fffffffffffffd34);
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                   CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
        if (bVar8) {
          local_102 = 1;
          break;
        }
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_118);
      }
      local_150 = local_30;
      local_158._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(in_stack_fffffffffffffd28);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end(in_stack_fffffffffffffd28);
      while (bVar8 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                                (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffffd28), bVar8) {
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator*(&local_158);
        std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
        basic_regex<std::char_traits<char>,std::allocator<char>>
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_fffffffffffffd70
                   ,in_stack_fffffffffffffd68,(flag_type)((ulong)in_stack_fffffffffffffd60 >> 0x20))
        ;
        bVar8 = std::
                regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                           in_stack_fffffffffffffd38,in_stack_fffffffffffffd34);
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                   CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
        if (bVar8) {
          local_102 = 0;
          break;
        }
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_158);
      }
      uVar4 = local_b4;
      pFVar1 = _stderr;
      local_102 = (local_102 & 1 & local_ac == 2) != 0;
      if ((bool)local_102) {
        if ((local_b4 == 0) || (local_b4 == 1)) {
          if (local_b4 == 1) {
            std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
                      ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                       in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
            pcVar6 = local_10;
            puVar13 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x1120d5
                                );
            std::istream::read(pcVar6,(long)puVar13);
            std::vector<float,_std::allocator<float>_>::resize
                      ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffd50,
                       in_stack_fffffffffffffd48);
            for (local_190 = 0; local_190 < local_c8; local_190 = local_190 + 1) {
              pvVar14 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                                  (&local_90,(long)local_190);
              vVar20 = (value_type)ggml_fp16_to_fp32(*pvVar14);
              pvVar15 = std::vector<float,_std::allocator<float>_>::operator[]
                                  (&local_a8,(long)local_190);
              *pvVar15 = vVar20;
            }
          }
          else {
            std::vector<float,_std::allocator<float>_>::resize
                      ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffd50,
                       in_stack_fffffffffffffd48);
            pcVar6 = local_10;
            pfVar18 = std::vector<float,_std::allocator<float>_>::data
                                ((vector<float,_std::allocator<float>_> *)0x1121b7);
            std::istream::read(pcVar6,(long)pfVar18);
          }
          local_b4 = local_34;
          goto LAB_0011226e;
        }
        uVar10 = ggml_type_name();
        fprintf(pFVar1,"%s: unsupported ttype %d (%s) for integer quantization\n",
                "ggml_common_quantize_0",(ulong)uVar4,uVar10);
        local_1 = 0;
        bVar8 = true;
      }
      else {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
        pcVar6 = local_10;
        puVar16 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x112246);
        std::istream::read(pcVar6,(long)puVar16);
LAB_0011226e:
        std::ostream::write((char *)local_18,(long)&local_ac);
        std::ostream::write((char *)local_18,(long)local_b0);
        std::ostream::write((char *)local_18,(long)&local_b4);
        for (local_198 = 0; pbVar5 = local_18, local_198 < local_ac; local_198 = local_198 + 1) {
          std::ostream::write((char *)local_18,(long)&local_d8 + (long)local_198 * 4);
        }
        lVar11 = std::__cxx11::string::operator[]((ulong)local_100);
        std::ostream::write((char *)pbVar5,lVar11);
        if ((local_102 & 1) == 0) {
          sVar19 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78);
          auVar23._8_4_ = (int)(sVar19 >> 0x20);
          auVar23._0_8_ = sVar19;
          auVar23._12_4_ = 0x45300000;
          printf("size = %8.3f MB\n",
                 ((auVar23._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar19) - 4503599627370496.0)) * 0.0009765625 *
                 0.0009765625);
          pbVar5 = local_18;
          in_stack_fffffffffffffd50 = &local_78;
          in_stack_fffffffffffffd60 =
               std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x112648);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffd50);
          std::ostream::write((char *)pbVar5,(long)in_stack_fffffffffffffd60);
          sVar19 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78);
          local_48 = sVar19 + local_48;
        }
        else {
          std::vector<float,_std::allocator<float>_>::resize
                    ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffd50,
                     in_stack_fffffffffffffd48);
          uVar4 = local_b4;
          local_1a0 = 0;
          if (local_b4 < 2) {
LAB_001124ac:
            in_stack_fffffffffffffd70 = _stderr;
            uVar10 = ggml_type_name();
            fprintf(in_stack_fffffffffffffd70,"%s: unsupported quantization type %d (%s)\n",
                    "ggml_common_quantize_0",(ulong)uVar4,uVar10);
            local_1 = 0;
            bVar8 = true;
            goto LAB_001126af;
          }
          if ((local_b4 - 2 < 2) || (local_b4 - 6 < 3)) {
LAB_0011242e:
            pfVar18 = std::vector<float,_std::allocator<float>_>::data
                                ((vector<float,_std::allocator<float>_> *)0x112446);
            pfVar17 = std::vector<float,_std::allocator<float>_>::data
                                ((vector<float,_std::allocator<float>_> *)0x112458);
            in_stack_fffffffffffffd28 =
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x0;
            local_1a0 = ggml_quantize_chunk(uVar4,pfVar18,pfVar17,0,(long)(local_c8 / (int)local_d8)
                                           );
          }
          else {
            if (local_b4 == 9) goto LAB_001124ac;
            if (local_b4 - 10 < 5) goto LAB_0011242e;
            if (((local_b4 - 0xf < 0x10) || (local_b4 - 0x22 < 2)) || (local_b4 == 0x27))
            goto LAB_001124ac;
          }
          in_stack_fffffffffffffd68 = local_18;
          pfVar18 = std::vector<float,_std::allocator<float>_>::data
                              ((vector<float,_std::allocator<float>_> *)0x112527);
          std::ostream::write((char *)in_stack_fffffffffffffd68,(long)pfVar18);
          local_48 = local_48 + local_1a0;
          lVar11 = (long)local_c8 << 2;
          auVar22._8_4_ = (int)((ulong)lVar11 >> 0x20);
          auVar22._0_8_ = lVar11;
          auVar22._12_4_ = 0x45300000;
          auVar26._8_4_ = (int)((ulong)local_1a0 >> 0x20);
          auVar26._0_8_ = local_1a0;
          auVar26._12_4_ = 0x45300000;
          printf("size = %8.2f MB -> %8.2f MB\n",
                 ((auVar22._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0)) * 0.0009765625 *
                 0.0009765625,
                 ((auVar26._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)local_1a0) - 4503599627370496.0)) * 0.0009765625
                 * 0.0009765625);
        }
        local_40 = (long)local_c8 * 4 + local_40;
        bVar8 = false;
      }
LAB_001126af:
      std::__cxx11::string::~string(local_100);
    } while (!bVar8);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)
               CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
               CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)
               CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
  }
LAB_0011283a:
  return (bool)(local_1 & 1);
}

Assistant:

bool ggml_common_quantize_0(
        std::ifstream & finp,
        std::ofstream & fout,
        const ggml_ftype ftype,
        const std::vector<std::string> & to_quant,
        const std::vector<std::string> & to_skip) {

    ggml_type qtype = GGML_TYPE_F32;

    switch (ftype) {
        case GGML_FTYPE_MOSTLY_Q4_0: qtype = GGML_TYPE_Q4_0; break;
        case GGML_FTYPE_MOSTLY_Q4_1: qtype = GGML_TYPE_Q4_1; break;
        case GGML_FTYPE_MOSTLY_Q5_0: qtype = GGML_TYPE_Q5_0; break;
        case GGML_FTYPE_MOSTLY_Q5_1: qtype = GGML_TYPE_Q5_1; break;
        case GGML_FTYPE_MOSTLY_Q8_0: qtype = GGML_TYPE_Q8_0; break;
        case GGML_FTYPE_MOSTLY_Q2_K: qtype = GGML_TYPE_Q2_K; break;
        case GGML_FTYPE_MOSTLY_Q3_K: qtype = GGML_TYPE_Q3_K; break;
        case GGML_FTYPE_MOSTLY_Q4_K: qtype = GGML_TYPE_Q4_K; break;
        case GGML_FTYPE_MOSTLY_Q5_K: qtype = GGML_TYPE_Q5_K; break;
        case GGML_FTYPE_MOSTLY_Q6_K: qtype = GGML_TYPE_Q6_K; break;
        case GGML_FTYPE_UNKNOWN:
        case GGML_FTYPE_ALL_F32:
        case GGML_FTYPE_MOSTLY_F16:
        case GGML_FTYPE_MOSTLY_Q4_1_SOME_F16:
        case GGML_FTYPE_MOSTLY_IQ2_XXS:
        case GGML_FTYPE_MOSTLY_IQ2_XS:
        case GGML_FTYPE_MOSTLY_IQ2_S:
        case GGML_FTYPE_MOSTLY_IQ3_XXS:
        case GGML_FTYPE_MOSTLY_IQ3_S:
        case GGML_FTYPE_MOSTLY_IQ1_S:
        case GGML_FTYPE_MOSTLY_IQ4_NL:
        case GGML_FTYPE_MOSTLY_IQ4_XS:
        case GGML_FTYPE_MOSTLY_IQ1_M:
        case GGML_FTYPE_MOSTLY_BF16:
                {
                    fprintf(stderr, "%s: invalid model type %d\n", __func__, ftype);
                    return false;
                }
    };

    if (!ggml_is_quantized(qtype)) {
        fprintf(stderr, "%s: invalid quantization type %d (%s)\n", __func__, qtype, ggml_type_name(qtype));
        return false;
    }

    size_t total_size_org = 0;
    size_t total_size_new = 0;

    std::vector<float> work;

    std::vector<uint8_t>     data_u8;
    std::vector<ggml_fp16_t> data_f16;
    std::vector<float>       data_f32;

    while (true) {
        int32_t n_dims;
        int32_t length;
        int32_t ttype;

        finp.read(reinterpret_cast<char *>(&n_dims), sizeof(n_dims));
        finp.read(reinterpret_cast<char *>(&length), sizeof(length));
        finp.read(reinterpret_cast<char *>(&ttype),  sizeof(ttype));

        if (finp.eof()) {
            break;
        }

        int32_t nelements = 1;
        int32_t ne[4] = { 1, 1, 1, 1 };
        for (int i = 0; i < n_dims; ++i) {
            finp.read (reinterpret_cast<char *>(&ne[i]), sizeof(ne[i]));
            nelements *= ne[i];
        }

        std::string name(length, 0);
        finp.read (&name[0], length);

        printf("%64s - [%5d, %5d, %5d], type = %6s ", name.data(), ne[0], ne[1], ne[2], ggml_type_name((ggml_type) ttype));

        bool quantize = false;

        // check if we should quantize this tensor
        for (const auto & s : to_quant) {
            if (std::regex_match(name, std::regex(s))) {
                quantize = true;
                break;
            }
        }

        // check if we should skip this tensor
        for (const auto & s : to_skip) {
            if (std::regex_match(name, std::regex(s))) {
                quantize = false;
                break;
            }
        }

        // quantize only 2D tensors
        quantize &= (n_dims == 2);

        if (quantize) {
            if (ttype != GGML_TYPE_F32 && ttype != GGML_TYPE_F16) {
                fprintf(stderr, "%s: unsupported ttype %d (%s) for integer quantization\n", __func__, ttype, ggml_type_name((ggml_type) ttype));
                return false;
            }

            if (ttype == GGML_TYPE_F16) {
                data_f16.resize(nelements);
                finp.read(reinterpret_cast<char *>(data_f16.data()), nelements * sizeof(ggml_fp16_t));
                data_f32.resize(nelements);
                for (int i = 0; i < nelements; ++i) {
                    data_f32[i] = ggml_fp16_to_fp32(data_f16[i]);
                }
            } else {
                data_f32.resize(nelements);
                finp.read(reinterpret_cast<char *>(data_f32.data()), nelements * sizeof(float));
            }

            ttype = qtype;
        } else {
            const int bpe = (ttype == 0) ? sizeof(float) : sizeof(uint16_t);

            data_u8.resize(nelements*bpe);
            finp.read(reinterpret_cast<char *>(data_u8.data()), nelements * bpe);
        }

        fout.write(reinterpret_cast<char *>(&n_dims), sizeof(n_dims));
        fout.write(reinterpret_cast<char *>(&length), sizeof(length));
        fout.write(reinterpret_cast<char *>(&ttype),  sizeof(ttype));
        for (int i = 0; i < n_dims; ++i) {
            fout.write(reinterpret_cast<char *>(&ne[i]), sizeof(ne[i]));
        }
        fout.write(&name[0], length);

        if (quantize) {
            work.resize(nelements); // for quantization

            size_t cur_size = 0;
            switch ((ggml_type) ttype) {
                case GGML_TYPE_Q4_0:
                case GGML_TYPE_Q4_1:
                case GGML_TYPE_Q5_0:
                case GGML_TYPE_Q5_1:
                case GGML_TYPE_Q8_0:
                case GGML_TYPE_Q2_K:
                case GGML_TYPE_Q3_K:
                case GGML_TYPE_Q4_K:
                case GGML_TYPE_Q5_K:
                case GGML_TYPE_Q6_K:
                    {
                        cur_size = ggml_quantize_chunk((ggml_type) ttype, data_f32.data(), work.data(), 0, nelements/ne[0], ne[0], nullptr);
                    } break;
                case GGML_TYPE_F32:
                case GGML_TYPE_F16:
                case GGML_TYPE_I8:
                case GGML_TYPE_I16:
                case GGML_TYPE_I32:
                case GGML_TYPE_I64:
                case GGML_TYPE_F64:
                case GGML_TYPE_Q8_1:
                case GGML_TYPE_Q8_K:
                case GGML_TYPE_IQ2_XXS:
                case GGML_TYPE_IQ2_XS:
                case GGML_TYPE_IQ2_S:
                case GGML_TYPE_IQ3_XXS:
                case GGML_TYPE_IQ3_S:
                case GGML_TYPE_IQ1_S:
                case GGML_TYPE_IQ4_NL:
                case GGML_TYPE_IQ4_XS:
                case GGML_TYPE_IQ1_M:
                case GGML_TYPE_BF16:
                case GGML_TYPE_TQ1_0:
                case GGML_TYPE_TQ2_0:
                case GGML_TYPE_COUNT:
                    {
                        fprintf(stderr, "%s: unsupported quantization type %d (%s)\n", __func__, ttype, ggml_type_name((ggml_type) ttype));
                        return false;
                    }
            }

            fout.write(reinterpret_cast<char *>(work.data()), cur_size);
            total_size_new += cur_size;

            printf("size = %8.2f MB -> %8.2f MB\n", nelements * sizeof(float)/1024.0/1024.0, cur_size/1024.0/1024.0);
        } else {
            printf("size = %8.3f MB\n", data_u8.size()/1024.0/1024.0);
            fout.write(reinterpret_cast<char *>(data_u8.data()), data_u8.size());
            total_size_new += data_u8.size();
        }

        total_size_org += nelements * sizeof(float);
    }

    printf("%s: model size  = %8.2f MB\n", __func__, total_size_org/1024.0/1024.0);
    printf("%s: quant size  = %8.2f MB | ftype = %d (%s)\n", __func__, total_size_new/1024.0/1024.0, ftype, ggml_type_name(qtype));

    return true;
}